

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

char16_t * __thiscall QUtf8::convertToUnicode(QUtf8 *this,char16_t *dst,QByteArrayView in)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  byte *pbVar26;
  long lVar27;
  byte in_R10B;
  uint c;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pbVar23 = (byte *)in.m_size;
  if ((2 < (long)dst) && (pbVar23[2] == 0xbf && *(short *)pbVar23 == -0x4411)) {
    pbVar23 = pbVar23 + 3;
    dst = (char16_t *)((long)dst + -3);
  }
  if (0 < (long)dst) {
    pbVar25 = (byte *)((long)dst + (long)pbVar23);
    do {
      pbVar26 = pbVar25;
      if (0xf < (long)pbVar25 - (long)pbVar23) {
        lVar27 = 0;
        lVar28 = 0;
LAB_00125782:
        if (lVar28 + 0x10 < (long)pbVar25 - (long)pbVar23) goto code_r0x00125791;
        this = this + ((long)pbVar25 - (long)pbVar23) * 2;
        auVar1 = *(undefined1 (*) [16])(pbVar25 + -0x10);
        uVar4 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
        auVar6[0xd] = 0;
        auVar6._0_13_ = auVar1._0_13_;
        auVar6[0xe] = auVar1[7];
        auVar8[0xc] = auVar1[6];
        auVar8._0_12_ = auVar1._0_12_;
        auVar8._13_2_ = auVar6._13_2_;
        auVar10[0xb] = 0;
        auVar10._0_11_ = auVar1._0_11_;
        auVar10._12_3_ = auVar8._12_3_;
        auVar12[10] = auVar1[5];
        auVar12._0_10_ = auVar1._0_10_;
        auVar12._11_4_ = auVar10._11_4_;
        auVar14[9] = 0;
        auVar14._0_9_ = auVar1._0_9_;
        auVar14._10_5_ = auVar12._10_5_;
        auVar16[8] = auVar1[4];
        auVar16._0_8_ = auVar1._0_8_;
        auVar16._9_6_ = auVar14._9_6_;
        auVar18._7_8_ = 0;
        auVar18._0_7_ = auVar16._8_7_;
        auVar21._1_8_ = SUB158(auVar18 << 0x40,7);
        auVar21[0] = auVar1[3];
        auVar21._9_6_ = 0;
        auVar22._1_10_ = SUB1510(auVar21 << 0x30,5);
        auVar22[0] = auVar1[2];
        auVar22._11_4_ = 0;
        auVar32._3_12_ = SUB1512(auVar22 << 0x20,3);
        auVar32[2] = auVar1[1];
        auVar32[0] = auVar1[0];
        auVar32[1] = 0;
        auVar32[0xf] = 0;
        *(undefined1 (*) [16])(this + -0x20) = auVar32;
        auVar30[1] = 0;
        auVar30[0] = auVar1[8];
        auVar30[2] = auVar1[9];
        auVar30[3] = 0;
        auVar30[4] = auVar1[10];
        auVar30[5] = 0;
        auVar30[6] = auVar1[0xb];
        auVar30[7] = 0;
        auVar30[8] = auVar1[0xc];
        auVar30[9] = 0;
        auVar30[10] = auVar1[0xd];
        auVar30[0xb] = 0;
        auVar30[0xc] = auVar1[0xe];
        auVar30[0xd] = 0;
        auVar30[0xe] = auVar1[0xf];
        auVar30[0xf] = 0;
        *(undefined1 (*) [16])(this + -0x10) = auVar30;
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        pbVar23 = pbVar25;
        if (uVar4 != 0) {
          pbVar26 = pbVar25 + ((ulong)uVar3 - 0xf);
          this = this + (ulong)uVar2 * 2 + -0x20;
          pbVar23 = pbVar25 + ((ulong)uVar2 - 0x10);
        }
        in_R10B = pbVar23 == pbVar25;
        goto LAB_00125849;
      }
      in_R10B = pbVar23 == pbVar25;
LAB_00125849:
      pbVar24 = pbVar23;
      if ((in_R10B & 1) != 0) {
        return (char16_t *)this;
      }
      do {
        pbVar23 = pbVar24 + 1;
        in_R10B = -1 < (char)*pbVar24;
        if ((bool)in_R10B) {
          *(ushort *)this = (ushort)*pbVar24;
        }
        else {
          *(char16_t *)this = L'�';
        }
        this = this + 2;
        pbVar24 = pbVar23;
      } while (pbVar23 < pbVar26);
    } while (pbVar23 < pbVar25);
  }
  return (char16_t *)this;
code_r0x00125791:
  auVar1 = *(undefined1 (*) [16])(pbVar23 + lVar28);
  uVar4 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar1._0_13_;
  auVar5[0xe] = auVar1[7];
  auVar7[0xc] = auVar1[6];
  auVar7._0_12_ = auVar1._0_12_;
  auVar7._13_2_ = auVar5._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar1._0_11_;
  auVar9._12_3_ = auVar7._12_3_;
  auVar11[10] = auVar1[5];
  auVar11._0_10_ = auVar1._0_10_;
  auVar11._11_4_ = auVar9._11_4_;
  auVar13[9] = 0;
  auVar13._0_9_ = auVar1._0_9_;
  auVar13._10_5_ = auVar11._10_5_;
  auVar15[8] = auVar1[4];
  auVar15._0_8_ = auVar1._0_8_;
  auVar15._9_6_ = auVar13._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar15._8_7_;
  auVar19._1_8_ = SUB158(auVar17 << 0x40,7);
  auVar19[0] = auVar1[3];
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = auVar1[2];
  auVar20._11_4_ = 0;
  auVar31._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar31[2] = auVar1[1];
  auVar31[0] = auVar1[0];
  auVar31[1] = 0;
  auVar31[0xf] = 0;
  *(undefined1 (*) [16])(this + lVar27) = auVar31;
  auVar29[1] = 0;
  auVar29[0] = auVar1[8];
  auVar29[2] = auVar1[9];
  auVar29[3] = 0;
  auVar29[4] = auVar1[10];
  auVar29[5] = 0;
  auVar29[6] = auVar1[0xb];
  auVar29[7] = 0;
  auVar29[8] = auVar1[0xc];
  auVar29[9] = 0;
  auVar29[10] = auVar1[0xd];
  auVar29[0xb] = 0;
  auVar29[0xc] = auVar1[0xe];
  auVar29[0xd] = 0;
  auVar29[0xe] = auVar1[0xf];
  auVar29[0xf] = 0;
  *(undefined1 (*) [16])(this + lVar27 + 0x10) = auVar29;
  if (uVar4 != 0) {
    uVar2 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    pbVar26 = pbVar23 + lVar28 + (ulong)uVar3 + 1;
    pbVar23 = pbVar23 + (ulong)uVar2 + lVar28;
    this = this + lVar27 + (ulong)uVar2 * 2;
    in_R10B = pbVar23 == pbVar25;
  }
  lVar27 = lVar27 + 0x20;
  lVar28 = lVar28 + 0x10;
  if (uVar4 != 0) goto LAB_00125849;
  goto LAB_00125782;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in) noexcept
{
    // check if have to skip a BOM
    auto bom = QByteArrayView::fromArray(utf8bom);
    if (in.size() >= bom.size() && in.first(bom.size()) == bom)
        in.slice(sizeof(utf8bom));

    return convertToUnicode(dst, in, [](char16_t *&dst, ...) {
        // decoding error
        *dst++ = QChar::ReplacementCharacter;
        return true;        // continue decoding
    });
}